

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isxdigit.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
  if ((iVar1 < 0x62) && (0x60 < _PDCLIB_lc_ctype->Xdigits_high)) {
LAB_001021ed:
    if (_PDCLIB_lc_ctype->Xdigits_high < 0x66) goto LAB_001021f3;
LAB_0010222a:
    if (_PDCLIB_lc_ctype->Xdigits_high < 0x67) goto LAB_00102230;
LAB_0010223c:
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x21,"! isxdigit( \'g\' )");
    iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
  }
  else {
    if ((0x61 < _PDCLIB_lc_ctype->xdigits_low) || (_PDCLIB_lc_ctype->xdigits_high < 0x61)) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
             ,0x1f,"isxdigit( \'a\' )");
      iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
    }
    if (iVar1 < 0x67) goto LAB_001021ed;
LAB_001021f3:
    if ((0x66 < _PDCLIB_lc_ctype->xdigits_low) || (_PDCLIB_lc_ctype->xdigits_high < 0x66)) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
             ,0x20,"isxdigit( \'f\' )");
      iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
    }
    if (iVar1 < 0x68) goto LAB_0010222a;
LAB_00102230:
    if ((_PDCLIB_lc_ctype->xdigits_low < 0x68) && (0x66 < _PDCLIB_lc_ctype->xdigits_high))
    goto LAB_0010223c;
  }
  if ((iVar1 < 0x42) && (0x40 < _PDCLIB_lc_ctype->Xdigits_high)) {
LAB_001022a4:
    if (_PDCLIB_lc_ctype->Xdigits_high < 0x46) goto LAB_001022aa;
LAB_001022e1:
    if (_PDCLIB_lc_ctype->Xdigits_high < 0x47) goto LAB_001022e7;
  }
  else {
    if ((0x41 < _PDCLIB_lc_ctype->xdigits_low) || (_PDCLIB_lc_ctype->xdigits_high < 0x41)) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
             ,0x22,"isxdigit( \'A\' )");
      iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
    }
    if (iVar1 < 0x47) goto LAB_001022a4;
LAB_001022aa:
    if ((0x46 < _PDCLIB_lc_ctype->xdigits_low) || (_PDCLIB_lc_ctype->xdigits_high < 0x46)) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
             ,0x23,"isxdigit( \'F\' )");
      iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
    }
    if (iVar1 < 0x48) goto LAB_001022e1;
LAB_001022e7:
    if ((0x47 < _PDCLIB_lc_ctype->xdigits_low) || (_PDCLIB_lc_ctype->xdigits_high < 0x47))
    goto LAB_00102319;
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
         ,0x24,"! isxdigit( \'G\' )");
  iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
LAB_00102319:
  if (((iVar1 < 0x41) && (0x3f < _PDCLIB_lc_ctype->Xdigits_high)) ||
     ((_PDCLIB_lc_ctype->xdigits_low < 0x41 && (0x3f < _PDCLIB_lc_ctype->xdigits_high)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x25,"! isxdigit( \'@\' )");
    iVar1 = _PDCLIB_lc_ctype->Xdigits_low;
  }
  if (((iVar1 < 0x21) && (0x1f < _PDCLIB_lc_ctype->Xdigits_high)) ||
     ((_PDCLIB_lc_ctype->xdigits_low < 0x21 && (0x1f < _PDCLIB_lc_ctype->xdigits_high)))) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x26,"! isxdigit( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int isxdigit( int c )
{
    return ( isdigit( c ) ||
             ( c >= _PDCLIB_lc_ctype->Xdigits_low && c <= _PDCLIB_lc_ctype->Xdigits_high ) ||
             ( c >= _PDCLIB_lc_ctype->xdigits_low && c <= _PDCLIB_lc_ctype->xdigits_high )
           );
}